

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib553.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  curl_slist *pcVar3;
  int len;
  curl_slist *hl;
  curl_slist *headerlist;
  int i;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  headerlist._4_4_ = 2;
  hl = (curl_slist *)0x0;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      for (headerlist._0_4_ = 0; (int)headerlist < 8; headerlist._0_4_ = (int)headerlist + 1) {
        iVar1 = curl_msnprintf(buf,0x13ec,"Header%d: ",(int)headerlist);
        memset(buf + iVar1,0x41,5000);
        buf[iVar1 + 5000] = '\0';
        pcVar3 = (curl_slist *)curl_slist_append(hl,buf);
        if (pcVar3 == (curl_slist *)0x0) goto LAB_00101457;
        hl = pcVar3;
      }
      pcVar3 = (curl_slist *)curl_slist_append(hl,"Expect: ");
      if (((((pcVar3 != (curl_slist *)0x0) &&
            (headerlist._4_4_ = curl_easy_setopt(lVar2,0x2712,URL), hl = pcVar3,
            headerlist._4_4_ == 0)) &&
           (headerlist._4_4_ = curl_easy_setopt(lVar2,0x2727,pcVar3), headerlist._4_4_ == 0)) &&
          ((headerlist._4_4_ = curl_easy_setopt(lVar2,0x2f,1), headerlist._4_4_ == 0 &&
           (headerlist._4_4_ = curl_easy_setopt(lVar2,0x3c,0xa000), headerlist._4_4_ == 0)))) &&
         ((headerlist._4_4_ = curl_easy_setopt(lVar2,0x29,1), headerlist._4_4_ == 0 &&
          ((headerlist._4_4_ = curl_easy_setopt(lVar2,0x2a,1), headerlist._4_4_ == 0 &&
           (headerlist._4_4_ = curl_easy_setopt(lVar2,0x4e2c,myreadfunc), headerlist._4_4_ == 0)))))
         ) {
        headerlist._4_4_ = curl_easy_perform(lVar2);
      }
LAB_00101457:
      curl_easy_cleanup(lVar2);
      curl_slist_free_all(hl);
      curl_global_cleanup();
      URL_local._4_4_ = headerlist._4_4_;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_FAILED_INIT;
  int i;
  struct curl_slist *headerlist = NULL, *hl;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  for(i = 0; i < NUM_HEADERS; i++) {
    int len = msnprintf(buf, sizeof(buf), "Header%d: ", i);
    memset(&buf[len], 'A', SIZE_HEADERS);
    buf[len + SIZE_HEADERS] = 0; /* zero terminate */
    hl = curl_slist_append(headerlist,  buf);
    if(!hl)
      goto test_cleanup;
    headerlist = hl;
  }

  hl = curl_slist_append(headerlist, "Expect: ");
  if(!hl)
    goto test_cleanup;
  headerlist = hl;

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_HTTPHEADER, headerlist);
  test_setopt(curl, CURLOPT_POST, 1L);
#ifdef CURL_DOES_CONVERSIONS
  /* Convert the POST data to ASCII */
  test_setopt(curl, CURLOPT_TRANSFERTEXT, 1L);
#endif
  test_setopt(curl, CURLOPT_POSTFIELDSIZE, (long)POSTLEN);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);
  test_setopt(curl, CURLOPT_HEADER, 1L);
  test_setopt(curl, CURLOPT_READFUNCTION, myreadfunc);

  res = curl_easy_perform(curl);

test_cleanup:

  curl_easy_cleanup(curl);

  curl_slist_free_all(headerlist);

  curl_global_cleanup();

  return (int)res;
}